

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programEntity.c
# Opt level: O3

void sysbvm_programEntity_recordChild
               (sysbvm_context_t *context,sysbvm_tuple_t programEntity,sysbvm_tuple_t child)

{
  _Bool _Var1;
  sysbvm_tuple_t orderedCollection;
  
  _Var1 = sysbvm_tuple_isKindOf
                    (context,programEntity,(context->roots).programEntityWithChildrenType);
  if ((programEntity != child) && (_Var1)) {
    orderedCollection = *(sysbvm_tuple_t *)(programEntity + 0x28);
    if (orderedCollection == 0) {
      orderedCollection = sysbvm_orderedCollection_create(context);
      *(sysbvm_tuple_t *)(programEntity + 0x28) = orderedCollection;
    }
    sysbvm_orderedCollection_add(context,orderedCollection,child);
    return;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_programEntity_recordChild(sysbvm_context_t *context, sysbvm_tuple_t programEntity, sysbvm_tuple_t child)
{
    if(!sysbvm_tuple_isKindOf(context, programEntity, context->roots.programEntityWithChildrenType)) return;
    if(programEntity == child) return;

    sysbvm_programEntityWithChildren_t *programEntityWithChildrenObject = (sysbvm_programEntityWithChildren_t*)programEntity;
    if(!programEntityWithChildrenObject->children)
        programEntityWithChildrenObject->children = sysbvm_orderedCollection_create(context);
    sysbvm_orderedCollection_add(context, programEntityWithChildrenObject->children, child);
}